

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

_Bool ggml_thread_apply_priority(int32_t prio)

{
  ulong uVar1;
  FILE *__stream;
  char in_AL;
  uint __errnum;
  int iVar2;
  pthread_t __target_thread;
  char *pcVar3;
  sched_param p;
  sched_param local_1c;
  
  uVar1 = (ulong)(uint)prio;
  iVar2 = 0;
  if ((uint)prio < 4) {
    in_AL = (char)(&switchD_00110b49::switchdataD_0016a688)[uVar1] + -0x78;
    switch(uVar1) {
    case 0:
      local_1c.__sched_priority = 0;
      iVar2 = 0;
      goto LAB_00110b76;
    case 1:
      local_1c.__sched_priority = 0x28;
      break;
    case 2:
      local_1c.__sched_priority = 0x50;
      break;
    case 3:
      local_1c.__sched_priority = 0x5a;
    }
    iVar2 = 1;
  }
LAB_00110b76:
  if (prio != 0) {
    __target_thread = pthread_self();
    __errnum = pthread_setschedparam(__target_thread,iVar2,&local_1c);
    __stream = _stderr;
    in_AL = (char)__errnum;
    if (__errnum != 0) {
      pcVar3 = strerror(__errnum);
      iVar2 = fprintf(__stream,"warn: failed to set thread priority %d : %s (%d)\n",uVar1,pcVar3,
                      (ulong)__errnum);
      in_AL = (char)iVar2;
    }
  }
  return (_Bool)in_AL;
}

Assistant:

static bool ggml_thread_apply_priority(int32_t prio) {
    struct sched_param p;
    int32_t policy = SCHED_OTHER;
    switch (prio) {
        case GGML_SCHED_PRIO_NORMAL:   policy = SCHED_OTHER; p.sched_priority = 0;  break;
        case GGML_SCHED_PRIO_MEDIUM:   policy = SCHED_FIFO;  p.sched_priority = 40; break;
        case GGML_SCHED_PRIO_HIGH:     policy = SCHED_FIFO;  p.sched_priority = 80; break;
        case GGML_SCHED_PRIO_REALTIME: policy = SCHED_FIFO;  p.sched_priority = 90; break;
    }

    if (prio == GGML_SCHED_PRIO_NORMAL) {
        // Keep inherited policy/priority
        return true;
    }

    int32_t err = pthread_setschedparam(pthread_self(), policy, &p);
    if (err != 0) {
        fprintf(stderr, "warn: failed to set thread priority %d : %s (%d)\n", prio, strerror(err), err);
        return false;
    }

    return true;
}